

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectSourceEntries
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles,cmXMLWriter *_xml,string *projectPath,cmMakefile *mf,
          string *projectType,string *targetName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  string *psVar6;
  char *this_00;
  cmExtraCodeLiteGenerator *pcVar7;
  string outputPath;
  string relapath;
  string codeliteCompilerName;
  SystemInformation info;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  SystemInformation local_38;
  
  FindMatchingHeaderfiles(this,cFiles,otherFiles);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"VirtualDirectory","");
  cmXMLWriter::StartElement(_xml,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (cmExtraCodeLiteGenerator *)_xml;
  cmXMLWriter::Attribute<char[4]>(_xml,"Name",(char (*) [4])0x4c0275);
  CreateFoldersAndFiles(pcVar7,cFiles,_xml,projectPath);
  cmXMLWriter::EndElement(_xml);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"VirtualDirectory","");
  cmXMLWriter::StartElement(_xml,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (cmExtraCodeLiteGenerator *)_xml;
  cmXMLWriter::Attribute<char[8]>(_xml,"Name",(char (*) [8])0x4bee98);
  CreateFoldersAndFiles(pcVar7,otherFiles,_xml,projectPath);
  cmXMLWriter::EndElement(_xml);
  cmsys::SystemInformation::SystemInformation(&local_38);
  cmsys::SystemInformation::RunCPUCheck(&local_38);
  uVar4 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&local_38);
  uVar5 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_38);
  this->CpuCount = uVar5 * uVar4;
  GetCodeLiteCompilerName_abi_cxx11_(&local_78,this,mf);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Settings","");
  cmXMLWriter::StartElement(_xml,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Type",projectType);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Configuration","");
  cmXMLWriter::StartElement(_xml,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Name",&this->ConfigName);
  GetCodeLiteCompilerName_abi_cxx11_(&local_b8,this,mf);
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"CompilerType",&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[17]>(_xml,"DebuggerType",(char (*) [17])"GNU gdb debugger");
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Type",projectType);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildCmpWithGlobalSettings",(char (*) [7])0x4a9a6b);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildLnkWithGlobalSettings",(char (*) [7])0x4a9a6b);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildResWithGlobalSettings",(char (*) [7])0x4a9a6b);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Compiler","");
  cmXMLWriter::StartElement(_xml,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[3]>(_xml,"Options",(char (*) [3])"-g");
  cmXMLWriter::Attribute<char[4]>(_xml,"Required",(char (*) [4])"yes");
  cmXMLWriter::Attribute<char[1]>(_xml,"PreCompiledHeader",(char (*) [1])0x4e2dd2);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"IncludePath","");
  cmXMLWriter::StartElement(_xml,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x4bee95);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Linker","");
  cmXMLWriter::StartElement(_xml,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x4e2dd2);
  cmXMLWriter::Attribute<char[4]>(_xml,"Required",(char (*) [4])"yes");
  cmXMLWriter::EndElement(_xml);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ResourceCompiler","");
  cmXMLWriter::StartElement(_xml,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x4e2dd2);
  cmXMLWriter::Attribute<char[3]>(_xml,"Required",(char (*) [3])0x4e230e);
  cmXMLWriter::EndElement(_xml);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"General","");
  cmXMLWriter::StartElement(_xml,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"CMAKE_RUNTIME_OUTPUT_DIRECTORY","");
  psVar6 = cmMakefile::GetSafeDefinition(mf,&local_98);
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if (local_b8._M_string_length == 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"EXECUTABLE_OUTPUT_PATH","")
    ;
    cmMakefile::GetSafeDefinition(mf,&local_98);
    std::__cxx11::string::_M_assign((string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if (local_b8._M_string_length == 0) {
    cmXMLWriter::Attribute<char[40]>
              (_xml,"OutputFile",(char (*) [40])"$(IntermediateDirectory)/$(ProjectName)");
  }
  else {
    cmSystemTools::RelativePath(&local_d8,projectPath,&local_b8);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
    paVar1 = &local_d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"OutputFile",&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  cmXMLWriter::Attribute<char[3]>(_xml,"IntermediateDirectory",(char (*) [3])0x4ce498);
  cmXMLWriter::Attribute<char[17]>(_xml,"Command",(char (*) [17])"./$(ProjectName)");
  cmXMLWriter::Attribute<char[1]>(_xml,"CommandArguments",(char (*) [1])0x4e2dd2);
  if (local_b8._M_string_length == 0) {
    cmXMLWriter::Attribute<char[25]>
              (_xml,"WorkingDirectory",(char (*) [25])"$(IntermediateDirectory)");
  }
  else {
    cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"WorkingDirectory",&local_98);
  }
  cmXMLWriter::Attribute<char[4]>(_xml,"PauseExecWhenProcTerminates",(char (*) [4])"yes");
  cmXMLWriter::EndElement(_xml);
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Debugger","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[3]>(_xml,"IsRemote",(char (*) [3])0x4e230e);
  cmXMLWriter::Attribute<char[1]>(_xml,"RemoteHostName",(char (*) [1])0x4e2dd2);
  cmXMLWriter::Attribute<char[1]>(_xml,"RemoteHostPort",(char (*) [1])0x4e2dd2);
  cmXMLWriter::Attribute<char[1]>(_xml,"DebuggerPath",(char (*) [1])0x4e2dd2);
  cmXMLWriter::Element(_xml,"PostConnectCommands");
  cmXMLWriter::Element(_xml,"StartupCommands");
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::Element(_xml,"PreBuild");
  cmXMLWriter::Element(_xml,"PostBuild");
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CustomBuild","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[4]>(_xml,"Enabled",(char (*) [4])"yes");
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"RebuildCommand","");
  GetRebuildCommand(&local_58,this,mf,targetName);
  cmXMLWriter::StartElement(_xml,&local_d8);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_58);
  cmXMLWriter::EndElement(_xml);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CleanCommand","");
  GetCleanCommand(&local_58,this,mf,targetName);
  cmXMLWriter::StartElement(_xml,&local_d8);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_58);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"BuildCommand","");
  GetBuildCommand(&local_58,this,mf,targetName);
  cmXMLWriter::StartElement(_xml,&local_d8);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_58);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  this_00 = "SingleFileCommand";
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"SingleFileCommand","");
  GetSingleFileBuildCommand_abi_cxx11_(&local_58,(cmExtraCodeLiteGenerator *)this_00,mf);
  cmXMLWriter::StartElement(_xml,&local_d8);
  cmXMLWriter::Content<std::__cxx11::string>(_xml,&local_58);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Element(_xml,"PreprocessFileCommand");
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"WorkingDirectory","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  cmXMLWriter::Content<char[17]>(_xml,(char (*) [17])"$(WorkspacePath)");
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(_xml);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AdditionalRules","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Element(_xml,"CustomPostBuild");
  cmXMLWriter::Element(_xml,"CustomPreBuild");
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"GlobalSettings","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Compiler","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x4e2dd2);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"IncludePath","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x4bee95);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Linker","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x4e2dd2);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"LibraryPath","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x4bee95);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"ResourceCompiler","");
  cmXMLWriter::StartElement(_xml,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x4e2dd2);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemInformation::~SystemInformation(&local_38);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectSourceEntries(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles, cmXMLWriter* _xml,
  const std::string& projectPath, const cmMakefile* mf,
  const std::string& projectType, const std::string& targetName)
{
  cmXMLWriter& xml(*_xml);
  FindMatchingHeaderfiles(cFiles, otherFiles);
  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "src");

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  this->CreateFoldersAndFiles(cFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "include");
  this->CreateFoldersAndFiles(otherFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount =
    info.GetNumberOfLogicalCPU() * info.GetNumberOfPhysicalCPU();

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  xml.StartElement("Settings");
  xml.Attribute("Type", projectType);

  xml.StartElement("Configuration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("CompilerType", this->GetCodeLiteCompilerName(mf));
  xml.Attribute("DebuggerType", "GNU gdb debugger");
  xml.Attribute("Type", projectType);
  xml.Attribute("BuildCmpWithGlobalSettings", "append");
  xml.Attribute("BuildLnkWithGlobalSettings", "append");
  xml.Attribute("BuildResWithGlobalSettings", "append");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "-g");
  xml.Attribute("Required", "yes");
  xml.Attribute("PreCompiledHeader", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "yes");
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "no");
  xml.EndElement(); // ResourceCompiler

  xml.StartElement("General");
  std::string outputPath =
    mf->GetSafeDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
  if (outputPath.empty()) {
    outputPath = mf->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  std::string relapath;
  if (!outputPath.empty()) {
    relapath = cmSystemTools::RelativePath(projectPath, outputPath);
    xml.Attribute("OutputFile", relapath + "/$(ProjectName)");
  } else {
    xml.Attribute("OutputFile", "$(IntermediateDirectory)/$(ProjectName)");
  }
  xml.Attribute("IntermediateDirectory", "./");
  xml.Attribute("Command", "./$(ProjectName)");
  xml.Attribute("CommandArguments", "");
  if (!outputPath.empty()) {
    xml.Attribute("WorkingDirectory", relapath);
  } else {
    xml.Attribute("WorkingDirectory", "$(IntermediateDirectory)");
  }
  xml.Attribute("PauseExecWhenProcTerminates", "yes");
  xml.EndElement(); // General

  xml.StartElement("Debugger");
  xml.Attribute("IsRemote", "no");
  xml.Attribute("RemoteHostName", "");
  xml.Attribute("RemoteHostPort", "");
  xml.Attribute("DebuggerPath", "");
  xml.Element("PostConnectCommands");
  xml.Element("StartupCommands");
  xml.EndElement(); // Debugger

  xml.Element("PreBuild");
  xml.Element("PostBuild");

  xml.StartElement("CustomBuild");
  xml.Attribute("Enabled", "yes");
  xml.Element("RebuildCommand", GetRebuildCommand(mf, targetName));
  xml.Element("CleanCommand", GetCleanCommand(mf, targetName));
  xml.Element("BuildCommand", GetBuildCommand(mf, targetName));
  xml.Element("SingleFileCommand", GetSingleFileBuildCommand(mf));
  xml.Element("PreprocessFileCommand");
  xml.Element("WorkingDirectory", "$(WorkspacePath)");
  xml.EndElement(); // CustomBuild

  xml.StartElement("AdditionalRules");
  xml.Element("CustomPostBuild");
  xml.Element("CustomPreBuild");
  xml.EndElement(); // AdditionalRules

  xml.EndElement(); // Configuration
  xml.StartElement("GlobalSettings");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.StartElement("LibraryPath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // LibraryPath
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.EndElement(); // ResourceCompiler

  xml.EndElement(); // GlobalSettings
  xml.EndElement(); // Settings
}